

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

char * crn_get_mip_filter_name(crn_mip_filter f)

{
  if (f < cCRNMipFilterTotal) {
    return &DAT_001a8f84 + *(int *)(&DAT_001a8f84 + (ulong)f * 4);
  }
  return "?";
}

Assistant:

const char* crn_get_mip_filter_name(crn_mip_filter f)
{
    switch (f)
    {
    case cCRNMipFilterBox:
        return "box";
    case cCRNMipFilterTent:
        return "tent";
    case cCRNMipFilterLanczos4:
        return "lanczos4";
    case cCRNMipFilterMitchell:
        return "mitchell";
    case cCRNMipFilterKaiser:
        return "kaiser";
    default:
        break;
    }
    return "?";
}